

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall
QPDFJob::doProcessOnce
          (QPDFJob *this,unique_ptr<QPDF,_std::default_delete<QPDF>_> *pdf,
          function<void_(QPDF_*,_const_char_*)> *fn,char *password,bool empty,bool used_for_input,
          bool main_input)

{
  type pdf_00;
  pointer pQVar1;
  element_type *__s;
  element_type *peVar2;
  PDFVersion PVar3;
  PDFVersion local_88;
  PDFVersion local_78 [2];
  allocator<char> local_59;
  string local_58;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> local_38;
  byte local_2b;
  byte local_2a;
  byte local_29;
  bool main_input_local;
  bool used_for_input_local;
  char *pcStack_28;
  bool empty_local;
  char *password_local;
  function<void_(QPDF_*,_const_char_*)> *fn_local;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> *pdf_local;
  QPDFJob *this_local;
  
  local_2b = main_input;
  local_2a = used_for_input;
  local_29 = empty;
  pcStack_28 = password;
  password_local = (char *)fn;
  fn_local = (function<void_(QPDF_*,_const_char_*)> *)pdf;
  pdf_local = (unique_ptr<QPDF,_std::default_delete<QPDF>_> *)this;
  std::make_unique<QPDF>();
  std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::operator=
            ((unique_ptr<QPDF,_std::default_delete<QPDF>_> *)fn_local,&local_38);
  std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::~unique_ptr(&local_38);
  pdf_00 = std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::operator*
                     ((unique_ptr<QPDF,_std::default_delete<QPDF>_> *)fn_local);
  setQPDFOptions(this,pdf_00);
  if ((local_29 & 1) == 0) {
    if (((local_2b & 1) == 0) ||
       (peVar2 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this), (peVar2->json_input & 1U) == 0)) {
      pQVar1 = std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::get
                         ((unique_ptr<QPDF,_std::default_delete<QPDF>_> *)fn_local);
      std::function<void_(QPDF_*,_const_char_*)>::operator()(fn,pQVar1,pcStack_28);
    }
    else {
      pQVar1 = std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::operator->
                         ((unique_ptr<QPDF,_std::default_delete<QPDF>_> *)fn_local);
      peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      __s = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                      (&(peVar2->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,__s,&local_59);
      QPDF::createFromJSON(pQVar1,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(&local_59);
    }
  }
  else {
    pQVar1 = std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::operator->
                       ((unique_ptr<QPDF,_std::default_delete<QPDF>_> *)fn_local);
    QPDF::emptyPDF(pQVar1);
  }
  if ((local_2a & 1) != 0) {
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    pQVar1 = std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::operator->
                       ((unique_ptr<QPDF,_std::default_delete<QPDF>_> *)fn_local);
    PVar3 = QPDF::getVersionAsPDFVersion(pQVar1);
    local_88._0_8_ = PVar3._0_8_;
    local_78[0].major_version = local_88.major_version;
    local_78[0].minor_version = local_88.minor_version;
    local_88.extension_level = PVar3.extension_level;
    local_78[0].extension_level = local_88.extension_level;
    PDFVersion::updateIfGreater(&peVar2->max_input_version,local_78);
  }
  return;
}

Assistant:

void
QPDFJob::doProcessOnce(
    std::unique_ptr<QPDF>& pdf,
    std::function<void(QPDF*, char const*)> fn,
    char const* password,
    bool empty,
    bool used_for_input,
    bool main_input)
{
    pdf = std::make_unique<QPDF>();
    setQPDFOptions(*pdf);
    if (empty) {
        pdf->emptyPDF();
    } else if (main_input && m->json_input) {
        pdf->createFromJSON(m->infilename.get());
    } else {
        fn(pdf.get(), password);
    }
    if (used_for_input) {
        m->max_input_version.updateIfGreater(pdf->getVersionAsPDFVersion());
    }
}